

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5250::ktxStreamTest_CanCreateAutoKtxFromCppStream_Test::TestBody
          (ktxStreamTest_CanCreateAutoKtxFromCppStream_Test *this)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  AssertionResult *pAVar4;
  void **value;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_1;
  KtxTexture<ktxTexture> texture;
  AssertionResult gtest_ar_;
  ktx_error_code_e err;
  StreambufStream ktxStream;
  AssertionResult gtest_ar;
  undefined1 local_230 [8];
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  undefined1 local_220 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_218;
  long local_210;
  undefined1 local_208 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  ktx_error_code_e local_1e4;
  undefined8 local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  StreambufStream local_1c0;
  undefined1 local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [7];
  ios_base local_118 [264];
  
  StreambufStream::StreambufStream(&local_1c0,&(this->super_ktxStreamTest)._ktx2Streambuf,_S_in);
  local_210 = 0;
  local_1e4 = ktxTexture_CreateFromStream
                        (local_1c0._stream._M_t.
                         super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                         super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                         super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl,1);
  local_208._0_4_ = KTX_SUCCESS;
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_198,"err","KTX_SUCCESS",&local_1e4,(ktx_error_code_e *)local_208);
  if (local_198[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_208._4_4_,local_208._0_4_) + 0x10),
               "Failed to create auto-detected KTX from C++ stream: ",0x34);
    pcVar2 = (char *)ktxErrorString(local_1e4);
    lVar1 = CONCAT44(local_208._4_4_,local_208._0_4_);
    if (pcVar2 == (char *)0x0) {
      sVar3 = 6;
      pcVar2 = "(null)";
    }
    else {
      sVar3 = strlen(pcVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar1 + 0x10),pcVar2,sVar3);
    if (local_190 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_190->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
               ,0x16d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_230,(Message *)local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_230);
    if ((long *)CONCAT44(local_208._4_4_,local_208._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_208._4_4_,local_208._0_4_) + 8))();
    }
  }
  if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_190,local_190);
  }
  local_1e0 = 0;
  if (local_210 == 0) {
    local_1c8 = "texture";
    local_1d0 = "nullptr";
    local_1d8 = "!=";
    testing::AssertionFailure();
    pAVar4 = testing::AssertionResult::operator<<
                       ((AssertionResult *)local_230,(char (*) [12])"Expected: (");
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,&local_1c8);
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [3])") ");
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,&local_1d8);
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [3])0x13c2e5);
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,&local_1d0);
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [12])"), actual: ");
    std::__cxx11::stringstream::stringstream((stringstream *)local_198);
    std::ostream::_M_insert<void_const*>(local_188);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base(local_118);
    pAVar4 = testing::AssertionResult::operator<<
                       (pAVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_208);
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [5])" vs ");
    testing::PrintToString<decltype(nullptr)>((string *)local_198,(testing *)&local_1e0,value);
    pAVar4 = testing::AssertionResult::operator<<
                       (pAVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_198);
    testing::AssertionResult::AssertionResult((AssertionResult *)local_220,pAVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_198._1_7_,local_198[0]) != local_188) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_198._1_7_,local_198[0]),
                      local_188[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_208._4_4_,local_208._0_4_) != &local_1f8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_208._4_4_,local_208._0_4_),
                      local_1f8._M_allocated_capacity + 1);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_228._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_228._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
  }
  else {
    testing::AssertionSuccess();
  }
  if (local_220[0] == false) {
    testing::Message::Message((Message *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT71(local_198._1_7_,local_198[0]) + 0x10),
               "Newly-created auto-detected KTX is null",0x27);
    if (local_218._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_218._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_208,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
               ,0x16e,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_208,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_208);
    if ((long *)CONCAT71(local_198._1_7_,local_198[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_198._1_7_,local_198[0]) + 8))();
    }
    if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._M_head_impl ==
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) goto LAB_0010b978;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_218;
  }
  else {
    if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_218._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_218,local_218._M_head_impl);
    }
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_200;
    local_208[0] = local_1c0._destructed;
    local_200._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_1c0._destructed == false) {
      testing::Message::Message((Message *)local_230);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_230 + 0x10),
                 "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)",0x3f);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)local_208,
                 (AssertionResult *)"ktxStream.destructed()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_220,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
                 ,0x16f,(char *)CONCAT71(local_198._1_7_,local_198[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_220,(Message *)local_230);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_198._1_7_,local_198[0]) != local_188) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_198._1_7_,local_198[0]),
                        local_188[0]._M_allocated_capacity + 1);
      }
      if (local_230 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_230 + 8))();
      }
    }
    local_218._M_head_impl = local_200._M_head_impl;
    if (local_200._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_0010b978;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_218._M_head_impl);
LAB_0010b978:
  if (local_210 != 0) {
    (*(code *)**(undefined8 **)(local_210 + 8))();
    local_210 = 0;
  }
  StreambufStream::~StreambufStream(&local_1c0);
  return;
}

Assistant:

TEST_F(ktxStreamTest, CanCreateAutoKtxFromCppStream)
{
    StreambufStream ktxStream{std::move(_ktx2Streambuf), std::ios::in}; // Or could use the KTx1, no difference
    KtxTexture<ktxTexture> texture;

    KTX_error_code err = ktxTexture_CreateFromStream(ktxStream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture.pHandle());
    EXPECT_EQ(err, KTX_SUCCESS) << "Failed to create auto-detected KTX from C++ stream: " << ktxErrorString(err);
    ASSERT_NE(texture, nullptr) << "Newly-created auto-detected KTX is null";
    EXPECT_TRUE(ktxStream.destructed()) << "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)";
}